

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNDescr.cpp
# Opt level: O2

void __thiscall NaNeuralNetDescr::MakeDefaultDelays(NaNeuralNetDescr *this)

{
  NaReal *pNVar1;
  uint uVar2;
  
  NaVector::new_dim(&this->vInputDelays,this->nInputsRepeat);
  NaVector::new_dim(&this->vOutputDelays,this->nOutputsRepeat);
  for (uVar2 = 0; uVar2 < this->nInputsRepeat; uVar2 = uVar2 + 1) {
    pNVar1 = NaVector::operator[](&this->vInputDelays,uVar2);
    *pNVar1 = (double)uVar2;
  }
  for (uVar2 = 0; uVar2 < this->nOutputsRepeat; uVar2 = uVar2 + 1) {
    pNVar1 = NaVector::operator[](&this->vOutputDelays,uVar2);
    *pNVar1 = (double)uVar2;
  }
  return;
}

Assistant:

void
NaNeuralNetDescr::MakeDefaultDelays ()
{
    vInputDelays.new_dim(nInputsRepeat);
    vOutputDelays.new_dim(nOutputsRepeat);

    /* default delays */
    unsigned	i;
    for(i = 0; i < nInputsRepeat; ++i)
      vInputDelays[i] = i;
    for(i = 0; i < nOutputsRepeat; ++i)
      vOutputDelays[i] = i;
}